

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void idr_set_num_beutf16(uchar *p,int num)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)num;
  uVar3 = SUB162(auVar2 % ZEXT816(0xb640),0);
  uVar4 = uVar3 % 0x510;
  uVar1 = idr_set_num_beutf16::xdig[uVar3 / 0x510];
  *p = (uchar)(uVar1 >> 8);
  p[1] = (uchar)uVar1;
  uVar1 = idr_set_num_beutf16::xdig[uVar4 / 0x24];
  p[2] = (uchar)(uVar1 >> 8);
  p[3] = (uchar)uVar1;
  uVar1 = idr_set_num_beutf16::xdig[uVar4 % 0x24];
  p[4] = (uchar)(uVar1 >> 8);
  p[5] = (uchar)uVar1;
  return;
}

Assistant:

static void
idr_set_num_beutf16(unsigned char *p, int num)
{
	static const uint16_t xdig[] = {
		0x0030, 0x0031, 0x0032, 0x0033, 0x0034, 0x0035,
		0x0036, 0x0037, 0x0038, 0x0039,
		0x0041, 0x0042, 0x0043, 0x0044, 0x0045, 0x0046,
		0x0047, 0x0048, 0x0049, 0x004A, 0x004B, 0x004C,
		0x004D, 0x004E, 0x004F, 0x0050, 0x0051, 0x0052,
		0x0053, 0x0054, 0x0055, 0x0056, 0x0057, 0x0058,
		0x0059, 0x005A
	};
#define XDIG_CNT	(sizeof(xdig)/sizeof(xdig[0]))

	num %= XDIG_CNT * XDIG_CNT * XDIG_CNT;
	archive_be16enc(p, xdig[(num / (XDIG_CNT * XDIG_CNT))]);
	num %= XDIG_CNT * XDIG_CNT;
	archive_be16enc(p+2, xdig[ (num / XDIG_CNT)]);
	num %= XDIG_CNT;
	archive_be16enc(p+4, xdig[num]);
}